

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

void __thiscall
Annotator_getVariablePairFromId_Test::TestBody(Annotator_getVariablePairFromId_Test *this)

{
  undefined8 uVar1;
  string *psVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  char cVar7;
  undefined4 uVar8;
  char *pcVar9;
  bool bVar10;
  AssertionResult gtest_ar_10;
  VariablePairPtr vpc;
  AssertionResult gtest_ar_;
  VariablePairPtr vpm;
  ResetPtr reset;
  AnnotatorPtr annotator;
  ComponentPtr c1;
  ComponentPtr c2;
  ModelPtr model;
  UnitsPtr units;
  VariablePtr v4;
  VariablePtr v3;
  VariablePtr v2;
  VariablePtr v1;
  AssertionResult local_1a8;
  long local_198 [2];
  shared_ptr<libcellml::Units> local_188;
  CellmlElementType local_178 [2];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  shared_ptr<libcellml::Component> local_168;
  string *local_158;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  long local_148 [2];
  shared_ptr<libcellml::Reset> local_138;
  long local_128 [2];
  CellmlElementType local_118 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  unsigned_long local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  shared_ptr *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  long local_e8 [2];
  CellmlElementType local_d4;
  shared_ptr<libcellml::Component> local_d0;
  long *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  shared_ptr *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  shared_ptr<libcellml::Model> local_a0;
  shared_ptr<libcellml::Units> local_90;
  long local_80 [2];
  long *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  unsigned_long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  shared_ptr<libcellml::Variable> local_50;
  shared_ptr<libcellml::Variable> local_40;
  
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"model","");
  local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"c1","");
  local_158 = (string *)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"c2","");
  local_f8 = (shared_ptr *)local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"v1","");
  local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"v2","");
  createModelTwoComponentsWithOneVariableEach
            ((string *)&local_a0,(string *)&local_1a8,(string *)&local_138,(string *)&local_158,
             (string *)&local_f8);
  if (local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_80) {
    operator_delete(local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    ,local_80[0] + 1);
  }
  if (local_f8 != (shared_ptr *)local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  if (local_158 != (string *)local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  if (local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_128) {
    operator_delete(local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_128[0] + 1);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  libcellml::Annotator::create();
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"units","");
  libcellml::Units::create((string *)&local_90);
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  peVar6 = local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"metre","");
  local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"unit1_id","");
  libcellml::Units::addUnit((string *)peVar6,1.0,(string *)&local_1a8);
  if (local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_128) {
    operator_delete(local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_128[0] + 1);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  peVar6 = local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"second","");
  local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"unit2_id","");
  libcellml::Units::addUnit((string *)peVar6,1.0,(string *)&local_1a8);
  if (local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_128) {
    operator_delete(local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_128[0] + 1);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  peVar6 = local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"newton","");
  local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"unit3_id","");
  libcellml::Units::addUnit((string *)peVar6,1.0,(string *)&local_1a8);
  if (local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_128) {
    operator_delete(local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_128[0] + 1);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  libcellml::Model::addUnits
            ((shared_ptr *)
             local_a0.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  peVar5 = local_a0.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"c1","");
  libcellml::ComponentEntity::component((string *)&local_d0,SUB81(peVar5,0));
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  peVar5 = local_a0.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"c2","");
  libcellml::ComponentEntity::component((string *)&local_b0,SUB81(peVar5,0));
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"v1","");
  libcellml::Component::variable((string *)&local_40);
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"v2","");
  libcellml::Component::variable((string *)&local_50);
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"v3","");
  libcellml::Variable::create((string *)&local_60);
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"v4","");
  libcellml::Variable::create((string *)&local_70);
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  libcellml::Component::addVariable
            ((shared_ptr *)
             local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable(local_b0);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"encapsulation_id","");
  libcellml::ComponentEntity::setEncapsulationId
            ((string *)
             local_a0.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  peVar4 = local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"component_ref1_id","");
  libcellml::ComponentEntity::setEncapsulationId((string *)peVar4);
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"component_ref2_id","");
  libcellml::ComponentEntity::setEncapsulationId((string *)local_b0);
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"v1","");
  libcellml::Component::variable((string *)&local_158);
  psVar2 = local_158;
  local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"public_and_private","");
  libcellml::Variable::setInterfaceType(psVar2);
  if (local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_128) {
    operator_delete(local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_128[0] + 1);
  }
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"v2","");
  libcellml::Component::variable((string *)&local_158);
  psVar2 = local_158;
  local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"public_and_private","");
  libcellml::Variable::setInterfaceType(psVar2);
  if (local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_128) {
    operator_delete(local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_128[0] + 1);
  }
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"v3","");
  libcellml::Component::variable((string *)&local_158);
  psVar2 = local_158;
  local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"public_and_private","");
  libcellml::Variable::setInterfaceType(psVar2);
  if (local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_128) {
    operator_delete(local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_128[0] + 1);
  }
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"v4","");
  libcellml::Component::variable((string *)&local_158);
  psVar2 = local_158;
  local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"public_and_private","");
  libcellml::Variable::setInterfaceType(psVar2);
  if (local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_128) {
    operator_delete(local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_128[0] + 1);
  }
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"v1","");
  libcellml::Component::variable((string *)&local_158);
  local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"v2","");
  libcellml::Component::variable((string *)&local_188);
  libcellml::Variable::addEquivalence((shared_ptr *)&local_158,(shared_ptr *)&local_188);
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_128) {
    operator_delete(local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_128[0] + 1);
  }
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"v3","");
  libcellml::Component::variable((string *)&local_158);
  local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"v4","");
  libcellml::Component::variable((string *)&local_188);
  libcellml::Variable::addEquivalence((shared_ptr *)&local_158,(shared_ptr *)&local_188);
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_128) {
    operator_delete(local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_128[0] + 1);
  }
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"v1","");
  libcellml::Component::variable((string *)&local_188);
  local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"v2","");
  libcellml::Component::variable((string *)local_178);
  local_158 = (string *)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"map_id","");
  libcellml::Variable::setEquivalenceMappingId
            ((shared_ptr *)&local_188,(shared_ptr *)local_178,(string *)&local_158);
  if (local_158 != (string *)local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  if (local_170.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170.ptr_);
  }
  if (local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_128) {
    operator_delete(local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_128[0] + 1);
  }
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"v1","");
  libcellml::Component::variable((string *)&local_188);
  local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"v2","");
  libcellml::Component::variable((string *)local_178);
  local_158 = (string *)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"connection_id","");
  libcellml::Variable::setEquivalenceConnectionId
            ((shared_ptr *)&local_188,(shared_ptr *)local_178,(string *)&local_158);
  if (local_158 != (string *)local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  if (local_170.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170.ptr_);
  }
  if (local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_128) {
    operator_delete(local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_128[0] + 1);
  }
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  libcellml::Reset::create();
  peVar3 = local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"reset_value_id","");
  libcellml::Reset::setResetValueId((string *)peVar3);
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  peVar3 = local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"test_value_id","");
  libcellml::Reset::setTestValueId((string *)peVar3);
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  libcellml::Component::addReset
            ((shared_ptr *)
             local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Annotator::setModel(local_f8);
  local_178[0] = UNIT;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"unit1_id","");
  libcellml::Annotator::item((string *)&local_188);
  uVar8 = libcellml::AnyCellmlElement::type();
  local_108 = CONCAT44(local_108._4_4_,uVar8);
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)&local_158,"libcellml::CellmlElementType::UNIT",
             "annotator->item(\"unit1_id\")->type()",local_178,(CellmlElementType *)&local_108);
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if (local_158._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x8c,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"unit1_id","");
  libcellml::Annotator::item((string *)&local_108);
  libcellml::AnyCellmlElement::unitsItem();
  libcellml::UnitsItem::units();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((internal *)&local_158,"units","annotator->item(\"unit1_id\")->unitsItem()->units()",
             &local_90,&local_188);
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170.ptr_);
  }
  if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if (local_158._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x8d,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_108 = 0;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"unit1_id","");
  libcellml::Annotator::item((string *)local_178);
  libcellml::AnyCellmlElement::unitsItem();
  local_c0 = (long *)libcellml::UnitsItem::index();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_158,"size_t(0)",
             "annotator->item(\"unit1_id\")->unitsItem()->index()",&local_108,
             (unsigned_long *)&local_c0);
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170.ptr_);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if (local_158._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x8e,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178[0] = UNIT;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"unit2_id","");
  libcellml::Annotator::item((string *)&local_188);
  uVar8 = libcellml::AnyCellmlElement::type();
  local_108 = CONCAT44(local_108._4_4_,uVar8);
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)&local_158,"libcellml::CellmlElementType::UNIT",
             "annotator->item(\"unit2_id\")->type()",local_178,(CellmlElementType *)&local_108);
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if (local_158._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x8f,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"unit2_id","");
  libcellml::Annotator::item((string *)&local_108);
  libcellml::AnyCellmlElement::unitsItem();
  libcellml::UnitsItem::units();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((internal *)&local_158,"units","annotator->item(\"unit2_id\")->unitsItem()->units()",
             &local_90,&local_188);
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170.ptr_);
  }
  if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if (local_158._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x90,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_108 = 1;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"unit2_id","");
  libcellml::Annotator::item((string *)local_178);
  libcellml::AnyCellmlElement::unitsItem();
  local_c0 = (long *)libcellml::UnitsItem::index();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_158,"size_t(1)",
             "annotator->item(\"unit2_id\")->unitsItem()->index()",&local_108,
             (unsigned_long *)&local_c0);
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170.ptr_);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if (local_158._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x91,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178[0] = UNIT;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"unit3_id","");
  libcellml::Annotator::item((string *)&local_188);
  uVar8 = libcellml::AnyCellmlElement::type();
  local_108 = CONCAT44(local_108._4_4_,uVar8);
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)&local_158,"libcellml::CellmlElementType::UNIT",
             "annotator->item(\"unit3_id\")->type()",local_178,(CellmlElementType *)&local_108);
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if (local_158._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x92,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"unit3_id","");
  libcellml::Annotator::item((string *)&local_108);
  libcellml::AnyCellmlElement::unitsItem();
  libcellml::UnitsItem::units();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((internal *)&local_158,"units","annotator->item(\"unit3_id\")->unitsItem()->units()",
             &local_90,&local_188);
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170.ptr_);
  }
  if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if (local_158._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x93,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_108 = 2;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"unit3_id","");
  libcellml::Annotator::item((string *)local_178);
  libcellml::AnyCellmlElement::unitsItem();
  local_c0 = (long *)libcellml::UnitsItem::index();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_158,"size_t(2)",
             "annotator->item(\"unit3_id\")->unitsItem()->index()",&local_108,
             (unsigned_long *)&local_c0);
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170.ptr_);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if (local_158._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x94,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178[0] = MAP_VARIABLES;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"map_id","");
  libcellml::Annotator::item((string *)&local_188);
  uVar8 = libcellml::AnyCellmlElement::type();
  local_108 = CONCAT44(local_108._4_4_,uVar8);
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)&local_158,"libcellml::CellmlElementType::MAP_VARIABLES",
             "annotator->item(\"map_id\")->type()",local_178,(CellmlElementType *)&local_108);
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if (local_158._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x98,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"map_id","");
  libcellml::Annotator::item((string *)&local_188);
  libcellml::AnyCellmlElement::variablePair();
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  libcellml::VariablePair::variable1();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
            ((internal *)&local_1a8,"v1","vpm->variable1()",&local_40,
             (shared_ptr<libcellml::Variable> *)&local_188);
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string)local_1a8.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_1a8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_1a8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x9a,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_178,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_178);
    if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') &&
         (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_188.
                              super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
      local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  libcellml::VariablePair::variable2();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
            ((internal *)&local_1a8,"v2","vpm->variable2()",&local_50,
             (shared_ptr<libcellml::Variable> *)&local_188);
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string)local_1a8.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_1a8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_1a8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x9b,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_178,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_178);
    if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') &&
         (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_188.
                              super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
      local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_108 = CONCAT44(local_108._4_4_,2);
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"connection_id","");
  libcellml::Annotator::item((string *)local_178);
  uVar8 = libcellml::AnyCellmlElement::type();
  local_c0 = (long *)CONCAT44(local_c0._4_4_,uVar8);
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)&local_188,"libcellml::CellmlElementType::CONNECTION",
             "annotator->item(\"connection_id\")->type()",(CellmlElementType *)&local_108,
             (CellmlElementType *)&local_c0);
  if (local_170.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170.ptr_);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x9c,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_178,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_178);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"connection_id","");
  libcellml::Annotator::item((string *)local_178);
  libcellml::AnyCellmlElement::variablePair();
  if (local_170.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170.ptr_);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  libcellml::VariablePair::variable1();
  uVar1 = local_1a8._0_8_;
  if (local_40.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)local_1a8._0_8_) {
    bVar10 = true;
  }
  else {
    libcellml::VariablePair::variable1();
    bVar10 = local_60 == local_108;
  }
  local_178[0] = CONCAT31(local_178[0]._1_3_,bVar10);
  local_170.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_40.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)uVar1) && (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
  }
  if (local_1a8.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8.message_.ptr_);
  }
  if ((string)(undefined1)local_178[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a8,(char *)local_178,"(v1 == vpc->variable1()) || (v3 == vpc->variable1())",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x9e,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
    }
    if (local_c0 != (long *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && (local_c0 != (long *)0x0)) {
        (**(code **)(*local_c0 + 8))();
      }
      local_c0 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::VariablePair::variable2();
  uVar1 = local_1a8._0_8_;
  if (local_50.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)local_1a8._0_8_) {
    bVar10 = true;
  }
  else {
    libcellml::VariablePair::variable2();
    bVar10 = local_70 == local_c0;
  }
  local_178[0] = CONCAT31(local_178[0]._1_3_,bVar10);
  local_170.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_50.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)uVar1) && (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_1a8.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8.message_.ptr_);
  }
  if ((string)(undefined1)local_178[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a8,(char *)local_178,"(v2 == vpc->variable2()) || (v4 == vpc->variable2())",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x9f,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
    }
    if (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') &&
         (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_168.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
      local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_118[0] = COMPONENT_REF;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"component_ref1_id","");
  libcellml::Annotator::item((string *)&local_168);
  local_d4 = libcellml::AnyCellmlElement::type();
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)local_178,"libcellml::CellmlElementType::COMPONENT_REF",
             "annotator->item(\"component_ref1_id\")->type()",local_118,&local_d4);
  if (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if ((string)(undefined1)local_178[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xa2,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"component_ref1_id","");
  libcellml::Annotator::item((string *)local_118);
  libcellml::AnyCellmlElement::component();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
            ((internal *)local_178,"c1","annotator->item(\"component_ref1_id\")->component()",
             &local_d0,&local_168);
  if (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if ((string)(undefined1)local_178[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xa3,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_118[0] = ENCAPSULATION;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"encapsulation_id","");
  libcellml::Annotator::item((string *)&local_168);
  local_d4 = libcellml::AnyCellmlElement::type();
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)local_178,"libcellml::CellmlElementType::ENCAPSULATION",
             "annotator->item(\"encapsulation_id\")->type()",local_118,&local_d4);
  if (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if ((string)(undefined1)local_178[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xa6,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"encapsulation_id","");
  libcellml::Annotator::item((string *)local_118);
  libcellml::AnyCellmlElement::model();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((internal *)local_178,"model","annotator->item(\"encapsulation_id\")->model()",
             &local_a0,(shared_ptr<libcellml::Model> *)&local_168);
  if (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if ((string)(undefined1)local_178[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xa7,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_118[0] = RESET_VALUE;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"reset_value_id","");
  libcellml::Annotator::item((string *)&local_168);
  local_d4 = libcellml::AnyCellmlElement::type();
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)local_178,"libcellml::CellmlElementType::RESET_VALUE",
             "annotator->item(\"reset_value_id\")->type()",local_118,&local_d4);
  if (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if ((string)(undefined1)local_178[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xaa,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"reset_value_id","");
  libcellml::Annotator::item((string *)local_118);
  libcellml::AnyCellmlElement::reset();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
            ((internal *)local_178,"reset","annotator->item(\"reset_value_id\")->reset()",&local_138
             ,(shared_ptr<libcellml::Reset> *)&local_168);
  if (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if ((string)(undefined1)local_178[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xab,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_118[0] = TEST_VALUE;
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"test_value_id","");
  libcellml::Annotator::item((string *)&local_168);
  local_d4 = libcellml::AnyCellmlElement::type();
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)local_178,"libcellml::CellmlElementType::TEST_VALUE",
             "annotator->item(\"test_value_id\")->type()",local_118,&local_d4);
  if (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if ((string)(undefined1)local_178[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xac,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8._0_8_ = (element_type *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"test_value_id","");
  libcellml::Annotator::item((string *)local_118);
  libcellml::AnyCellmlElement::reset();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
            ((internal *)local_178,"reset","annotator->item(\"test_value_id\")->reset()",&local_138,
             (shared_ptr<libcellml::Reset> *)&local_168);
  if (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
  }
  if ((element_type *)local_1a8._0_8_ != (element_type *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0] + 1);
  }
  if ((string)(undefined1)local_178[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xad,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      cVar7 = testing::internal::IsTrue(true);
      if ((cVar7 != '\0') && ((element_type *)local_1a8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      local_1a8._0_8_ = (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if (local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_50.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_40.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  if (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  if (local_a0.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return;
}

Assistant:

TEST(Annotator, duplicateIdBehaviour)
{
    auto model = libcellml::Model::create("model");
    auto annotator = libcellml::Annotator::create();
    auto component = libcellml::Component::create();
    auto variable = libcellml::Variable::create();

    model->setId("duplicateId");
    component->setId("duplicateId");
    variable->setId("duplicateId");

    component->addVariable(variable);
    model->addComponent(component);

    annotator->setModel(model);

    EXPECT_EQ(libcellml::CellmlElementType::UNDEFINED, annotator->item("duplicateId")->type());
    EXPECT_EQ(size_t(1), annotator->issueCount());

    EXPECT_FALSE(annotator->isUnique("duplicateId"));
    EXPECT_EQ(size_t(3), annotator->itemCount("duplicateId"));
}